

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::PeerManagerImpl::PackageToValidate::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  _Alloc_hider in_stack_ffffffffffffff58;
  string local_88;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_48,(base_blob<256u> *)(**this + 0x39));
  base_blob<256u>::ToString_abi_cxx11_(&local_68,(base_blob<256u> *)(**this + 0x59));
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)this + 0x18);
  base_blob<256u>::ToString_abi_cxx11_
            (&local_88,(base_blob<256u> *)(*(long *)(*(long *)((long)this + 8) + -0x10) + 0x39));
  base_blob<256u>::ToString_abi_cxx11_
            ((string *)&stack0xffffffffffffff58,
             (base_blob<256u> *)(*(long *)(*(long *)((long)this + 8) + -0x10) + 0x59));
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string,std::__cxx11::string,long>
            (__return_storage_ptr__,
             (tinyformat *)"parent %s (wtxid=%s, sender=%d) + child %s (wtxid=%s, sender=%d)",
             (char *)&local_48,&local_68,args_1,(long *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)((long)this + 0x20) + -8),(long *)in_stack_ffffffffffffff58._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString() const {
            Assume(m_txns.size() == 2);
            return strprintf("parent %s (wtxid=%s, sender=%d) + child %s (wtxid=%s, sender=%d)",
                             m_txns.front()->GetHash().ToString(),
                             m_txns.front()->GetWitnessHash().ToString(),
                             m_senders.front(),
                             m_txns.back()->GetHash().ToString(),
                             m_txns.back()->GetWitnessHash().ToString(),
                             m_senders.back());
        }